

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enum.hpp
# Opt level: O1

void Reflection::Enum::declare<Analyser::Static::Enterprise::Target::Speed>
               (char *name,char *declaration)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  allocator<char> local_91;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar2 = *declaration;
  bVar5 = cVar2 == '\0';
  if (!bVar5) {
    do {
      iVar3 = isalpha((int)cVar2);
      pcVar4 = declaration;
      while (iVar3 == 0) {
        pcVar1 = pcVar4 + 1;
        bVar5 = *pcVar1 == '\0';
        if (bVar5) goto LAB_0016a320;
        pcVar4 = pcVar4 + 1;
        iVar3 = isalpha((int)*pcVar1);
      }
      if (bVar5) break;
      declaration = pcVar4 + -1;
      do {
        cVar2 = declaration[1];
        declaration = declaration + 1;
        iVar3 = isalpha((int)cVar2);
      } while ((int)cVar2 - 0x30U < 10 || iVar3 != 0);
      local_90._0_8_ = &local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,pcVar4,declaration);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,local_80._M_allocated_capacity + 1);
      }
      cVar2 = *declaration;
      bVar5 = cVar2 == '\0';
    } while (!bVar5);
  }
LAB_0016a320:
  local_90._0_8_ = &Analyser::Static::Enterprise::Target::Speed::typeinfo;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_90 + 8),&local_48);
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&members_by_type__abi_cxx11_,local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_90 + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68._M_local_buf,name,&local_91)
  ;
  local_90._0_8_ = &Analyser::Static::Enterprise::Target::Speed::typeinfo;
  if ((uint *)local_68._M_allocated_capacity == &local_58) {
    uStack_70 = uStack_50;
    uStack_6c = uStack_4c;
    local_90._8_8_ = local_80._M_local_buf + 8;
  }
  else {
    local_90._8_8_ = local_68._M_allocated_capacity;
  }
  local_80._12_4_ = uStack_54;
  local_80._8_4_ = local_58;
  local_80._M_allocated_capacity = local_68._8_8_;
  local_68._8_8_ = 0;
  local_58 = local_58 & 0xffffff00;
  local_68._M_allocated_capacity = (size_type)&local_58;
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::__cxx11::string>,std::allocator<std::pair<std::type_index_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::type_index,std::__cxx11::string>>(&names_by_type__abi_cxx11_);
  if ((char *)local_90._8_8_ != local_80._M_local_buf + 8) {
    operator_delete((void *)local_90._8_8_,local_80._8_8_ + 1);
  }
  if ((uint *)local_68._M_allocated_capacity != &local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,CONCAT44(uStack_54,local_58) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

static void declare(const char *name, const char *declaration) {
			const char *d_ptr = declaration;

			std::vector<std::string> result;
			while(true) {
				// Skip non-alphas, and exit if the terminator is found.
				while(*d_ptr && !isalpha(*d_ptr)) ++d_ptr;
				if(!*d_ptr) break;

				// Note the current location and proceed for all alphas and digits.
				const auto start = d_ptr;
				while(isalpha(*d_ptr) || isdigit(*d_ptr)) ++d_ptr;

				// Add a string view.
				result.emplace_back(std::string(start, size_t(d_ptr - start)));
			}

			members_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), result));
			names_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), std::string(name)));
		}